

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QColor __thiscall QAccessibleWidget::foregroundColor(QAccessibleWidget *this)

{
  long lVar1;
  QColor *pQVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  ColorRole in_stack_ffffffffffffffbc;
  QWidget *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  widget((QAccessibleWidget *)0x7de8da);
  QWidget::palette(in_RDI);
  widget((QAccessibleWidget *)0x7de8f1);
  QWidget::foregroundRole(in_stack_ffffffffffffffd8);
  pQVar2 = QPalette::color((QPalette *)in_RDI,in_stack_ffffffffffffffbc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor QAccessibleWidget::foregroundColor() const
{
    return widget()->palette().color(widget()->foregroundRole());
}